

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalNinjaGenerator::CheckFortran(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  unsigned_long uVar1;
  long *plVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  size_type *psVar5;
  ostringstream e;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [376];
  
  uVar1 = this->NinjaSupportsDyndeps;
  if (uVar1 == 1) goto LAB_002672d5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (this->NinjaSupportsDyndeps == 0) {
    std::operator+(&local_1b8,"The Ninja generator does not support Fortran using Ninja version\n  "
                   ,&this->NinjaVersion);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1d8.field_2._M_allocated_capacity = *psVar5;
      local_1d8.field_2._8_8_ = puVar3[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar5;
      local_1d8._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_1d8._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) goto LAB_0026724d;
  }
  else {
    std::operator+(&local_1b8,
                   "The Ninja generator in this version of CMake does not support Fortran using Ninja version\n  "
                   ,&this->NinjaVersion);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1d8.field_2._M_allocated_capacity = *psVar5;
      local_1d8.field_2._8_8_ = plVar2[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar5;
      local_1d8._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_1d8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,".  This version of CMake is aware only of \'dyndep\' feature version 1.",0x45
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_0026724d:
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::s_FatalErrorOccured = true;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
LAB_002672d5:
  return uVar1 == 1;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckFortran(cmMakefile* mf) const
{
  if (this->NinjaSupportsDyndeps == 1) {
    return true;
  }

  std::ostringstream e;
  if (this->NinjaSupportsDyndeps == 0) {
    /* clang-format off */
    e <<
      "The Ninja generator does not support Fortran using Ninja version\n"
      "  " + this->NinjaVersion + "\n"
      "due to lack of required features.  "
      "Kitware has implemented the required features but as of this version "
      "of CMake they have not been integrated to upstream ninja.  "
      "Pending integration, Kitware maintains a branch at:\n"
      "  https://github.com/Kitware/ninja/tree/features-for-fortran#readme\n"
      "with the required features.  "
      "One may build ninja from that branch to get support for Fortran."
      ;
    /* clang-format on */
  } else {
    /* clang-format off */
    e <<
      "The Ninja generator in this version of CMake does not support Fortran "
      "using Ninja version\n"
      "  " + this->NinjaVersion + "\n"
      "because its 'dyndep' feature version is " <<
      this->NinjaSupportsDyndeps << ".  "
      "This version of CMake is aware only of 'dyndep' feature version 1."
      ;
    /* clang-format on */
  }
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  cmSystemTools::SetFatalErrorOccured();
  return false;
}